

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgsisx.c
# Opt level: O0

void sgsisx(superlu_options_t *options,SuperMatrix *A,int *perm_c,int *perm_r,int *etree,char *equed
           ,float *R,float *C,SuperMatrix *L,SuperMatrix *U,void *work,int_t lwork,SuperMatrix *B,
           SuperMatrix *X,float *recip_pivot_growth,float *rcond,GlobalLU_t *Glu,
           mem_usage_t *mem_usage,SuperLUStat_t *stat,int_t *info)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int n_00;
  int_t nnz_00;
  int *piVar4;
  long lVar5;
  int_t *piVar6;
  int_t *colptr_00;
  int_t *adjncy;
  int iVar7;
  int *piVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  float fVar16;
  float fVar17;
  double dVar18;
  int local_3d4;
  int local_3cc;
  float local_3c4;
  float local_3bc;
  float local_3b8;
  float local_3b4;
  float local_3b0;
  float local_3a8;
  float local_3a4;
  float local_3a0;
  char local_398 [8];
  char msg_1 [256];
  int *iperm;
  int *perm_tmp;
  int_t *rowind_1;
  int_t nnz_1;
  NCformat *Astore_2;
  char msg [256];
  float *nzval;
  int_t *rowind;
  int_t *colptr;
  int_t nnz;
  NCformat *Astore_1;
  int j_1;
  int i_1;
  NRformat *Astore;
  int *piStack_128;
  int ii;
  int *perm;
  double *utime;
  double t0;
  int info1;
  int panel_size;
  int relax;
  float rcmin;
  float rcmax;
  float rowcnd;
  float colcnd;
  float smlnum;
  float bignum;
  float anorm;
  float amax;
  int_t j;
  int_t i;
  uint uStack_d4;
  char norm [1];
  trans_t trant;
  int mc64;
  int permc_spec;
  int rowequ;
  int notran;
  int nofact;
  int equil;
  int colequ;
  SuperMatrix AC;
  SuperMatrix *AA;
  int n;
  int nrhs;
  int ldx;
  int ldb;
  float *Xmat;
  float *Bmat;
  DNformat *Xstore;
  DNformat *Bstore;
  char *equed_local;
  int *etree_local;
  int *perm_r_local;
  int *perm_c_local;
  SuperMatrix *A_local;
  superlu_options_t *options_local;
  
  piStack_128 = (int *)0x0;
  piVar8 = (int *)B->Store;
  piVar4 = (int *)X->Store;
  lVar10 = *(long *)(piVar8 + 2);
  lVar5 = *(long *)(piVar4 + 2);
  iVar1 = *piVar8;
  iVar2 = *piVar4;
  iVar3 = B->ncol;
  n_00 = B->nrow;
  *info = 0;
  bVar11 = options->Fact != FACTORED;
  bVar12 = options->Equil == YES;
  bVar13 = options->Trans == NOTRANS;
  uStack_d4 = (uint)(options->RowPerm == LargeDiag_MC64);
  if (bVar11) {
    *equed = 'N';
    bVar14 = false;
    bVar15 = false;
  }
  else {
    iVar7 = strncmp(equed,"R",1);
    bVar14 = true;
    if (iVar7 != 0) {
      iVar7 = strncmp(equed,"B",1);
      bVar14 = iVar7 == 0;
    }
    iVar7 = strncmp(equed,"C",1);
    bVar15 = true;
    if (iVar7 != 0) {
      iVar7 = strncmp(equed,"B",1);
      bVar15 = iVar7 == 0;
    }
    rowcnd = smach("Safe minimum");
    colcnd = 1.0 / rowcnd;
  }
  if ((((((options->Fact == DOFACT) || (options->Fact == SamePattern)) ||
        (options->Fact == SamePattern_SameRowPerm)) || (options->Fact == FACTORED)) &&
      (((options->Trans == NOTRANS || (options->Trans == TRANS)) || (options->Trans == CONJ)))) &&
     ((options->Equil == NO || (options->Equil == YES)))) {
    if (((A->nrow == A->ncol) && (-1 < A->nrow)) &&
       (((A->Stype == SLU_NC || (A->Stype == SLU_NR)) &&
        ((A->Dtype == SLU_S && (A->Mtype == SLU_GE)))))) {
      if ((((options->Fact != FACTORED) || (bVar14)) || (bVar15)) ||
         (iVar7 = strncmp(equed,"N",1), iVar7 == 0)) {
        if (bVar14) {
          panel_size = (int)colcnd;
          relax = 0;
          for (anorm = 0.0; (int)anorm < A->nrow; anorm = (float)((int)anorm + 1)) {
            if (R[(int)anorm] <= (float)panel_size) {
              local_3a0 = R[(int)anorm];
            }
            else {
              local_3a0 = (float)panel_size;
            }
            panel_size = (int)local_3a0;
            if ((float)relax < R[(int)anorm] || (float)relax == R[(int)anorm]) {
              local_3a4 = R[(int)anorm];
            }
            else {
              local_3a4 = (float)relax;
            }
            relax = (int)local_3a4;
          }
          if (0.0 < (float)panel_size) {
            if (A->nrow < 1) {
              rcmin = 1.0;
            }
            else {
              if ((float)panel_size <= rowcnd) {
                local_3a8 = rowcnd;
              }
              else {
                local_3a8 = (float)panel_size;
              }
              if (colcnd <= (float)relax) {
                local_3b0 = colcnd;
              }
              else {
                local_3b0 = (float)relax;
              }
              rcmin = local_3a8 / local_3b0;
            }
          }
          else {
            *info = -7;
          }
        }
        if ((bVar15) && (*info == 0)) {
          panel_size = (int)colcnd;
          relax = 0;
          for (anorm = 0.0; (int)anorm < A->nrow; anorm = (float)((int)anorm + 1)) {
            if (C[(int)anorm] <= (float)panel_size) {
              local_3b4 = C[(int)anorm];
            }
            else {
              local_3b4 = (float)panel_size;
            }
            panel_size = (int)local_3b4;
            if ((float)relax < C[(int)anorm] || (float)relax == C[(int)anorm]) {
              local_3b8 = C[(int)anorm];
            }
            else {
              local_3b8 = (float)relax;
            }
            relax = (int)local_3b8;
          }
          if (0.0 < (float)panel_size) {
            if (A->nrow < 1) {
              rcmax = 1.0;
            }
            else {
              if ((float)panel_size <= rowcnd) {
                local_3bc = rowcnd;
              }
              else {
                local_3bc = (float)panel_size;
              }
              if (colcnd <= (float)relax) {
                local_3c4 = colcnd;
              }
              else {
                local_3c4 = (float)relax;
              }
              rcmax = local_3bc / local_3c4;
            }
          }
          else {
            *info = -8;
          }
        }
        if (*info == 0) {
          if (lwork < -1) {
            *info = -0xc;
          }
          else {
            if (-1 < B->ncol) {
              if (A->nrow < 0) {
                local_3cc = 0;
              }
              else {
                local_3cc = A->nrow;
              }
              if (((local_3cc <= *piVar8) && (B->Stype == SLU_DN)) &&
                 ((B->Dtype == SLU_S && (B->Mtype == SLU_GE)))) {
                if (-1 < X->ncol) {
                  if (A->nrow < 0) {
                    local_3d4 = 0;
                  }
                  else {
                    local_3d4 = A->nrow;
                  }
                  if ((local_3d4 <= *piVar4) &&
                     ((((B->ncol == 0 || (B->ncol == X->ncol)) && (X->Stype == SLU_DN)) &&
                      ((X->Dtype == SLU_S && (X->Mtype == SLU_GE)))))) goto LAB_0010cfaa;
                }
                *info = -0xe;
                goto LAB_0010cfaa;
              }
            }
            *info = -0xd;
          }
        }
      }
      else {
        *info = -6;
      }
    }
    else {
      *info = -2;
    }
  }
  else {
    *info = -1;
  }
LAB_0010cfaa:
  if (*info == 0) {
    t0._4_4_ = sp_ienv(1);
    info1 = sp_ienv(2);
    perm = (int *)stat->utime;
    if (A->Stype == SLU_NR) {
      piVar6 = (int_t *)A->Store;
      AC.Store = superlu_malloc(0x20);
      sCreate_CompCol_Matrix
                ((SuperMatrix *)AC.Store,A->ncol,A->nrow,*piVar6,*(float **)(piVar6 + 2),
                 *(int_t **)(piVar6 + 4),*(int_t **)(piVar6 + 6),SLU_NC,A->Dtype,A->Mtype);
      bVar13 = !bVar13;
      i = (int_t)!bVar13;
    }
    else {
      i = options->Trans;
      AC.Store = A;
    }
    if (bVar11) {
      piVar6 = *(int_t **)((long)AC.Store + 0x18);
      nnz_00 = *piVar6;
      colptr_00 = *(int_t **)(piVar6 + 6);
      adjncy = *(int_t **)(piVar6 + 4);
      msg._248_8_ = *(undefined8 *)(piVar6 + 2);
      if (uStack_d4 != 0) {
        utime = (double *)SuperLU_timer_();
        piStack_128 = int32Malloc(n_00);
        if (piStack_128 == (int *)0x0) {
          sprintf((char *)&Astore_2,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for perm[]",
                  0x227,
                  "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sgsisx.c"
                 );
          superlu_abort_and_exit((char *)&Astore_2);
        }
        t0._0_4_ = sldperm(5,n_00,nnz_00,colptr_00,adjncy,(float *)msg._248_8_,piStack_128,R,C);
        if (t0._0_4_ == 0) {
          if (bVar12) {
            bVar15 = true;
            bVar14 = true;
            for (Astore_1._4_4_ = 0; Astore_1._4_4_ < n_00; Astore_1._4_4_ = Astore_1._4_4_ + 1) {
              dVar18 = exp((double)R[Astore_1._4_4_]);
              R[Astore_1._4_4_] = (float)dVar18;
              dVar18 = exp((double)C[Astore_1._4_4_]);
              C[Astore_1._4_4_] = (float)dVar18;
            }
            for (Astore_1._0_4_ = 0; (int)Astore_1 < n_00; Astore_1._0_4_ = (int)Astore_1 + 1) {
              for (Astore_1._4_4_ = colptr_00[(int)Astore_1];
                  Astore_1._4_4_ < colptr_00[(int)Astore_1 + 1]; Astore_1._4_4_ = Astore_1._4_4_ + 1
                  ) {
                *(float *)(msg._248_8_ + (long)Astore_1._4_4_ * 4) =
                     R[adjncy[Astore_1._4_4_]] * C[(int)Astore_1] *
                     *(float *)(msg._248_8_ + (long)Astore_1._4_4_ * 4);
              }
            }
            *equed = 'B';
          }
          for (Astore_1._0_4_ = 0; (int)Astore_1 < n_00; Astore_1._0_4_ = (int)Astore_1 + 1) {
            for (Astore_1._4_4_ = colptr_00[(int)Astore_1];
                Astore_1._4_4_ < colptr_00[(int)Astore_1 + 1]; Astore_1._4_4_ = Astore_1._4_4_ + 1)
            {
              adjncy[Astore_1._4_4_] = piStack_128[adjncy[Astore_1._4_4_]];
            }
          }
        }
        else {
          uStack_d4 = 0;
          superlu_free(piStack_128);
          piStack_128 = (int *)0x0;
        }
        dVar18 = SuperLU_timer_();
        *(double *)(perm + 8) = dVar18 - (double)utime;
      }
      if ((uStack_d4 == 0) && (bVar12)) {
        utime = (double *)SuperLU_timer_();
        sgsequ((SuperMatrix *)AC.Store,R,C,&rcmin,&rcmax,&bignum,(int *)&t0);
        if (t0._0_4_ == 0) {
          slaqgs((SuperMatrix *)AC.Store,R,C,rcmin,rcmax,bignum,equed);
          iVar7 = strncmp(equed,"R",1);
          bVar14 = true;
          if (iVar7 != 0) {
            iVar7 = strncmp(equed,"B",1);
            bVar14 = iVar7 == 0;
          }
          iVar7 = strncmp(equed,"C",1);
          bVar15 = true;
          if (iVar7 != 0) {
            iVar7 = strncmp(equed,"B",1);
            bVar15 = iVar7 == 0;
          }
        }
        dVar18 = SuperLU_timer_();
        *(double *)(perm + 8) = dVar18 - (double)utime;
      }
    }
    if (bVar11) {
      utime = (double *)SuperLU_timer_();
      if ((options->ColPerm != MY_PERMC) && (options->Fact == DOFACT)) {
        get_perm_c(options->ColPerm,(SuperMatrix *)AC.Store,perm_c);
      }
      dVar18 = SuperLU_timer_();
      *(double *)perm = dVar18 - (double)utime;
      utime = (double *)SuperLU_timer_();
      sp_preorder(options,(SuperMatrix *)AC.Store,perm_c,etree,(SuperMatrix *)&equil);
      dVar18 = SuperLU_timer_();
      *(double *)(perm + 6) = dVar18 - (double)utime;
      utime = (double *)SuperLU_timer_();
      sgsitrf(options,(SuperMatrix *)&equil,info1,t0._4_4_,etree,work,lwork,perm_c,perm_r,L,U,Glu,
              stat,info);
      dVar18 = SuperLU_timer_();
      *(double *)(perm + 0xe) = dVar18 - (double)utime;
      if (lwork == -1) {
        mem_usage->total_needed = (float)(*info - A->ncol);
        return;
      }
      if (uStack_d4 != 0) {
        iVar7 = **(int **)((long)AC.Store + 0x18);
        lVar9 = *(long *)(*(int **)((long)AC.Store + 0x18) + 4);
        piVar8 = int32Malloc(n_00 << 1);
        if (piVar8 == (int *)0x0) {
          sprintf(local_398,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for perm_tmp[]",0x27e
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sgsisx.c"
                 );
          superlu_abort_and_exit(local_398);
        }
        for (amax = 0.0; (int)amax < n_00; amax = (float)((int)amax + 1)) {
          piVar8[(int)amax] = perm_r[piStack_128[(int)amax]];
        }
        for (amax = 0.0; (int)amax < n_00; amax = (float)((int)amax + 1)) {
          perm_r[(int)amax] = piVar8[(int)amax];
          piVar8[(long)n_00 + (long)piStack_128[(int)amax]] = (int)amax;
        }
        for (amax = 0.0; (int)amax < iVar7; amax = (float)((int)amax + 1)) {
          *(int *)(lVar9 + (long)(int)amax * 4) =
               piVar8[(long)n_00 + (long)*(int *)(lVar9 + (long)(int)amax * 4)];
        }
        superlu_free(piStack_128);
        superlu_free(piVar8);
      }
    }
    if (options->PivotGrowth != NO) {
      if (0 < *info) {
        return;
      }
      fVar16 = sPivotGrowth(A->ncol,(SuperMatrix *)AC.Store,perm_c,L,U);
      *recip_pivot_growth = fVar16;
    }
    if (options->ConditionNumber != NO) {
      utime = (double *)SuperLU_timer_();
      if (bVar13) {
        j._3_1_ = 0x31;
      }
      else {
        j._3_1_ = 0x49;
      }
      smlnum = slangs((char *)((long)&j + 3),(SuperMatrix *)AC.Store);
      sgscon((char *)((long)&j + 3),L,U,smlnum,rcond,stat,(int *)&t0);
      dVar18 = SuperLU_timer_();
      *(double *)(perm + 0x20) = dVar18 - (double)utime;
    }
    if (0 < iVar3) {
      if (bVar13) {
        if (bVar14) {
          for (anorm = 0.0; (int)anorm < iVar3; anorm = (float)((int)anorm + 1)) {
            for (amax = 0.0; (int)amax < n_00; amax = (float)((int)amax + 1)) {
              lVar9 = (long)((int)amax + (int)anorm * iVar1);
              *(float *)(lVar10 + lVar9 * 4) = R[(int)amax] * *(float *)(lVar10 + lVar9 * 4);
            }
          }
        }
      }
      else if (bVar15) {
        for (anorm = 0.0; (int)anorm < iVar3; anorm = (float)((int)anorm + 1)) {
          for (amax = 0.0; (int)amax < n_00; amax = (float)((int)amax + 1)) {
            lVar9 = (long)((int)amax + (int)anorm * iVar1);
            *(float *)(lVar10 + lVar9 * 4) = C[(int)amax] * *(float *)(lVar10 + lVar9 * 4);
          }
        }
      }
      for (anorm = 0.0; (int)anorm < iVar3; anorm = (float)((int)anorm + 1)) {
        for (amax = 0.0; (int)amax < B->nrow; amax = (float)((int)amax + 1)) {
          *(undefined4 *)(lVar5 + (long)((int)amax + (int)anorm * iVar2) * 4) =
               *(undefined4 *)(lVar10 + (long)((int)amax + (int)anorm * iVar1) * 4);
        }
      }
      utime = (double *)SuperLU_timer_();
      sgstrs(i,L,U,perm_c,perm_r,X,stat,(int *)&t0);
      dVar18 = SuperLU_timer_();
      *(double *)(perm + 0x22) = dVar18 - (double)utime;
      if (bVar13) {
        if (bVar15) {
          for (anorm = 0.0; (int)anorm < iVar3; anorm = (float)((int)anorm + 1)) {
            for (amax = 0.0; (int)amax < n_00; amax = (float)((int)amax + 1)) {
              lVar10 = (long)((int)amax + (int)anorm * iVar2);
              *(float *)(lVar5 + lVar10 * 4) = C[(int)amax] * *(float *)(lVar5 + lVar10 * 4);
            }
          }
        }
      }
      else if (bVar14) {
        for (anorm = 0.0; (int)anorm < iVar3; anorm = (float)((int)anorm + 1)) {
          for (amax = 0.0; (int)amax < A->nrow; amax = (float)((int)amax + 1)) {
            lVar10 = (long)((int)amax + (int)anorm * iVar2);
            *(float *)(lVar5 + lVar10 * 4) = R[(int)amax] * *(float *)(lVar5 + lVar10 * 4);
          }
        }
      }
    }
    if (((options->ConditionNumber != NO) && (fVar16 = *rcond, fVar17 = smach("E"), fVar16 < fVar17)
        ) && (*info == 0)) {
      *info = A->ncol + 1;
    }
    if (bVar11) {
      ilu_sQuerySpace(L,U,mem_usage);
      Destroy_CompCol_Permuted((SuperMatrix *)&equil);
    }
    if (A->Stype == SLU_NR) {
      Destroy_SuperMatrix_Store((SuperMatrix *)AC.Store);
      superlu_free(AC.Store);
    }
  }
  else {
    Astore._4_4_ = -*info;
    input_error("sgsisx",(int *)((long)&Astore + 4));
  }
  return;
}

Assistant:

void
sgsisx(superlu_options_t *options, SuperMatrix *A, int *perm_c, int *perm_r,
       int *etree, char *equed, float *R, float *C,
       SuperMatrix *L, SuperMatrix *U, void *work, int_t lwork,
       SuperMatrix *B, SuperMatrix *X,
       float *recip_pivot_growth, float *rcond,
       GlobalLU_t *Glu, mem_usage_t *mem_usage, SuperLUStat_t *stat, int_t *info)
{

    DNformat  *Bstore, *Xstore;
    float    *Bmat, *Xmat;
    int       ldb, ldx, nrhs, n;
    SuperMatrix *AA;/* A in SLU_NC format used by the factorization routine.*/
    SuperMatrix AC; /* Matrix postmultiplied by Pc */
    int       colequ, equil, nofact, notran, rowequ, permc_spec, mc64;
    trans_t   trant;
    char      norm[1];
    int_t     i, j;
    float    amax, anorm, bignum, smlnum, colcnd, rowcnd, rcmax, rcmin;
    int       relax, panel_size, info1;
    double    t0;      /* temporary time */
    double    *utime;

    int *perm = NULL; /* permutation returned from MC64 */

    /* External functions */
    extern float slangs(char *, SuperMatrix *);

    Bstore = B->Store;
    Xstore = X->Store;
    Bmat   = Bstore->nzval;
    Xmat   = Xstore->nzval;
    ldb    = Bstore->lda;
    ldx    = Xstore->lda;
    nrhs   = B->ncol;
    n      = B->nrow;

    *info = 0;
    nofact = (options->Fact != FACTORED);
    equil = (options->Equil == YES);
    notran = (options->Trans == NOTRANS);
    mc64 = (options->RowPerm == LargeDiag_MC64);
    if ( nofact ) {
	*(unsigned char *)equed = 'N';
	rowequ = FALSE;
	colequ = FALSE;
    } else {
	rowequ = strncmp(equed, "R", 1)==0 || strncmp(equed, "B", 1)==0;
	colequ = strncmp(equed, "C", 1)==0 || strncmp(equed, "B", 1)==0;
	smlnum = smach("Safe minimum");  /* lamch_("Safe minimum"); */
	bignum = 1. / smlnum;
    }

    /* Test the input parameters */
    if ( (options->Fact != DOFACT && options->Fact != SamePattern &&
	  options->Fact != SamePattern_SameRowPerm &&
	  options->Fact != FACTORED) ||
	 (options->Trans != NOTRANS && options->Trans != TRANS && 
	  options->Trans != CONJ) ||
	 (options->Equil != NO && options->Equil != YES) )
	*info = -1;
    else if ( A->nrow != A->ncol || A->nrow < 0 ||
	      (A->Stype != SLU_NC && A->Stype != SLU_NR) ||
	      A->Dtype != SLU_S || A->Mtype != SLU_GE )
	*info = -2;
    else if ( options->Fact == FACTORED &&
	     !(rowequ || colequ || strncmp(equed, "N", 1)==0) )
	*info = -6;
    else {
	if (rowequ) {
	    rcmin = bignum;
	    rcmax = 0.;
	    for (j = 0; j < A->nrow; ++j) {
		rcmin = SUPERLU_MIN(rcmin, R[j]);
		rcmax = SUPERLU_MAX(rcmax, R[j]);
	    }
	    if (rcmin <= 0.) *info = -7;
	    else if ( A->nrow > 0)
		rowcnd = SUPERLU_MAX(rcmin,smlnum) / SUPERLU_MIN(rcmax,bignum);
	    else rowcnd = 1.;
	}
	if (colequ && *info == 0) {
	    rcmin = bignum;
	    rcmax = 0.;
	    for (j = 0; j < A->nrow; ++j) {
		rcmin = SUPERLU_MIN(rcmin, C[j]);
		rcmax = SUPERLU_MAX(rcmax, C[j]);
	    }
	    if (rcmin <= 0.) *info = -8;
	    else if (A->nrow > 0)
		colcnd = SUPERLU_MAX(rcmin,smlnum) / SUPERLU_MIN(rcmax,bignum);
	    else colcnd = 1.;
	}
	if (*info == 0) {
	    if ( lwork < -1 ) *info = -12;
	    else if ( B->ncol < 0 || Bstore->lda < SUPERLU_MAX(0, A->nrow) ||
		      B->Stype != SLU_DN || B->Dtype != SLU_S || 
		      B->Mtype != SLU_GE )
		*info = -13;
	    else if ( X->ncol < 0 || Xstore->lda < SUPERLU_MAX(0, A->nrow) ||
		      (B->ncol != 0 && B->ncol != X->ncol) ||
		      X->Stype != SLU_DN ||
		      X->Dtype != SLU_S || X->Mtype != SLU_GE )
		*info = -14;
	}
    }
    if (*info != 0) {
	int ii = -(*info);
	input_error("sgsisx", &ii);
	return;
    }

    /* Initialization for factor parameters */
    panel_size = sp_ienv(1);
    relax      = sp_ienv(2);

    utime = stat->utime;

    /* Convert A to SLU_NC format when necessary. */
    if ( A->Stype == SLU_NR ) {
	NRformat *Astore = A->Store;
	AA = (SuperMatrix *) SUPERLU_MALLOC( sizeof(SuperMatrix) );
	sCreate_CompCol_Matrix(AA, A->ncol, A->nrow, Astore->nnz,
			       Astore->nzval, Astore->colind, Astore->rowptr,
			       SLU_NC, A->Dtype, A->Mtype);
	if ( notran ) { /* Reverse the transpose argument. */
	    trant = TRANS;
	    notran = 0;
	} else {
	    trant = NOTRANS;
	    notran = 1;
	}
    } else { /* A->Stype == SLU_NC */
	trant = options->Trans;
	AA = A;
    }

    if ( nofact ) {
	register int i, j;
	NCformat *Astore = AA->Store;
	int_t nnz = Astore->nnz;
	int_t *colptr = Astore->colptr;
	int_t *rowind = Astore->rowind;
	float *nzval = (float *)Astore->nzval;

	if ( mc64 ) {
	    t0 = SuperLU_timer_();
	    if ((perm = int32Malloc(n)) == NULL)
		ABORT("SUPERLU_MALLOC fails for perm[]");

	    info1 = sldperm(5, n, nnz, colptr, rowind, nzval, perm, R, C);

	    if (info1 != 0) { /* MC64 fails, call sgsequ() later */
		mc64 = 0;
		SUPERLU_FREE(perm);
		perm = NULL;
	    } else {
	        if ( equil ) {
	            rowequ = colequ = 1;
		    for (i = 0; i < n; i++) {
		        R[i] = exp(R[i]);
		        C[i] = exp(C[i]);
		    }
		    /* scale the matrix */
		    for (j = 0; j < n; j++) {
		        for (i = colptr[j]; i < colptr[j + 1]; i++) {
			    nzval[i] *= R[rowind[i]] * C[j];
		        }
		    }
	            *equed = 'B';
                }

                /* permute the matrix */
		for (j = 0; j < n; j++) {
		    for (i = colptr[j]; i < colptr[j + 1]; i++) {
			/*nzval[i] *= R[rowind[i]] * C[j];*/
			rowind[i] = perm[rowind[i]];
		    }
		}
	    }
	    utime[EQUIL] = SuperLU_timer_() - t0;
	}

	if ( mc64==0 && equil ) { /* Only perform equilibration, no row perm */
	    t0 = SuperLU_timer_();
	    /* Compute row and column scalings to equilibrate the matrix A. */
	    sgsequ(AA, R, C, &rowcnd, &colcnd, &amax, &info1);

	    if ( info1 == 0 ) {
		/* Equilibrate matrix A. */
		slaqgs(AA, R, C, rowcnd, colcnd, amax, equed);
		rowequ = strncmp(equed, "R", 1)==0 || strncmp(equed, "B", 1)==0;
		colequ = strncmp(equed, "C", 1)==0 || strncmp(equed, "B", 1)==0;
	    }
	    utime[EQUIL] = SuperLU_timer_() - t0;
	}
    }


    if ( nofact ) {
	
	t0 = SuperLU_timer_();
	/*
	 * Gnet column permutation vector perm_c[], according to permc_spec:
	 *   permc_spec = NATURAL:  natural ordering 
	 *   permc_spec = MMD_AT_PLUS_A: minimum degree on structure of A'+A
	 *   permc_spec = MMD_ATA:  minimum degree on structure of A'*A
	 *   permc_spec = COLAMD:   approximate minimum degree column ordering
	 *   permc_spec = MY_PERMC: the ordering already supplied in perm_c[]
	 */
	permc_spec = options->ColPerm;
	if ( permc_spec != MY_PERMC && options->Fact == DOFACT )
	    get_perm_c(permc_spec, AA, perm_c);
	utime[COLPERM] = SuperLU_timer_() - t0;

	t0 = SuperLU_timer_();
	sp_preorder(options, AA, perm_c, etree, &AC);
	utime[ETREE] = SuperLU_timer_() - t0;

	/* Compute the LU factorization of A*Pc. */
	t0 = SuperLU_timer_();
	sgsitrf(options, &AC, relax, panel_size, etree, work, lwork,
                perm_c, perm_r, L, U, Glu, stat, info);
	utime[FACT] = SuperLU_timer_() - t0;

	if ( lwork == -1 ) {
	    mem_usage->total_needed = *info - A->ncol;
	    return;
	}

	if ( mc64 ) { /* Fold MC64's perm[] into perm_r[]. */
	    NCformat *Astore = AA->Store;
	    int_t nnz = Astore->nnz, *rowind = Astore->rowind;
	    int *perm_tmp, *iperm;
	    if ((perm_tmp = int32Malloc(2*n)) == NULL)
		ABORT("SUPERLU_MALLOC fails for perm_tmp[]");
	    iperm = perm_tmp + n;
	    for (i = 0; i < n; ++i) perm_tmp[i] = perm_r[perm[i]];
	    for (i = 0; i < n; ++i) {
		perm_r[i] = perm_tmp[i];
		iperm[perm[i]] = i;
	    }

	    /* Restore A's original row indices. */
	    for (i = 0; i < nnz; ++i) rowind[i] = iperm[rowind[i]];

	    SUPERLU_FREE(perm); /* MC64 permutation */
	    SUPERLU_FREE(perm_tmp);
	}
    }

    if ( options->PivotGrowth ) {
	if ( *info > 0 ) return;

	/* Compute the reciprocal pivot growth factor *recip_pivot_growth. */
	*recip_pivot_growth = sPivotGrowth(A->ncol, AA, perm_c, L, U);
    }

    if ( options->ConditionNumber ) {
	/* Estimate the reciprocal of the condition number of A. */
	t0 = SuperLU_timer_();
	if ( notran ) {
	    *(unsigned char *)norm = '1';
	} else {
	    *(unsigned char *)norm = 'I';
	}
	anorm = slangs(norm, AA);
	sgscon(norm, L, U, anorm, rcond, stat, &info1);
	utime[RCOND] = SuperLU_timer_() - t0;
    }

    if ( nrhs > 0 ) { /* Solve the system */

	/* Scale and permute the right-hand side if equilibration
           and permutation from MC64 were performed. */
	if ( notran ) {
	    if ( rowequ ) {
		for (j = 0; j < nrhs; ++j)
		    for (i = 0; i < n; ++i)
		        Bmat[i + j*ldb] *= R[i];
	    }
	} else if ( colequ ) {
	    for (j = 0; j < nrhs; ++j)
		for (i = 0; i < n; ++i) {
	            Bmat[i + j*ldb] *= C[i];
		}
	}

	/* Compute the solution matrix X. */
	for (j = 0; j < nrhs; j++)  /* Save a copy of the right hand sides */
	    for (i = 0; i < B->nrow; i++)
		Xmat[i + j*ldx] = Bmat[i + j*ldb];

	t0 = SuperLU_timer_();
	sgstrs (trant, L, U, perm_c, perm_r, X, stat, &info1);
	utime[SOLVE] = SuperLU_timer_() - t0;

	/* Transform the solution matrix X to a solution of the original
	   system. */
	if ( notran ) {
	    if ( colequ ) {
		for (j = 0; j < nrhs; ++j)
		    for (i = 0; i < n; ++i) {
                        Xmat[i + j*ldx] *= C[i];
                    }
	    }
	} else { /* transposed system */
	    if ( rowequ ) {
	        for (j = 0; j < nrhs; ++j)
		    for (i = 0; i < A->nrow; ++i) {
              	        Xmat[i + j*ldx] *= R[i];
                    }
	    }
	}

    } /* end if nrhs > 0 */

    if ( options->ConditionNumber ) {
	/* The matrix is singular to working precision. */
	/* if ( *rcond < slamch_("E") && *info == 0) *info = A->ncol + 1; */
	if ( *rcond < smach("E") && *info == 0) *info = A->ncol + 1;
    }

    if ( nofact ) {
	ilu_sQuerySpace(L, U, mem_usage);
	Destroy_CompCol_Permuted(&AC);
    }
    if ( A->Stype == SLU_NR ) {
	Destroy_SuperMatrix_Store(AA);
	SUPERLU_FREE(AA);
    }

}